

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int setup_traffic_protection(ptls_t *tls,ptls_cipher_suite_t *cs,int is_enc,char *secret_label)

{
  int iVar1;
  ptls_aead_context_t *ppVar2;
  anon_struct_144_2_4aec0f7d_for_traffic_protection *secret;
  
  secret = (anon_struct_144_2_4aec0f7d_for_traffic_protection *)&(tls->traffic_protection).enc;
  if (is_enc == 0) {
    secret = &tls->traffic_protection;
  }
  if ((secret_label != (char *)0x0) &&
     (iVar1 = derive_secret(tls->key_schedule,secret,secret_label), iVar1 != 0)) {
    return iVar1;
  }
  ppVar2 = (secret->dec).aead;
  if (ppVar2 != (ptls_aead_context_t *)0x0) {
    ptls_aead_free(ppVar2);
  }
  ppVar2 = ptls_aead_new(cs->aead,cs->hash,is_enc,secret);
  (secret->dec).aead = ppVar2;
  iVar1 = 0x201;
  if (ppVar2 != (ptls_aead_context_t *)0x0) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int setup_traffic_protection(ptls_t *tls, ptls_cipher_suite_t *cs, int is_enc, const char *secret_label)
{
    struct st_ptls_traffic_protection_t *ctx = is_enc ? &tls->traffic_protection.enc : &tls->traffic_protection.dec;

    if (secret_label != NULL) {
        int ret;
        if ((ret = derive_secret(tls->key_schedule, ctx->secret, secret_label)) != 0)
            return ret;
    }

    if (ctx->aead != NULL)
        ptls_aead_free(ctx->aead);
    if ((ctx->aead = ptls_aead_new(cs->aead, cs->hash, is_enc, ctx->secret)) == NULL)
        return PTLS_ERROR_NO_MEMORY; /* TODO obtain error from ptls_aead_new */
    PTLS_DEBUGF("[%s] %02x%02x,%02x%02x\n", secret_label, (unsigned)ctx->secret[0], (unsigned)ctx->secret[1],
                (unsigned)ctx->aead->static_iv[0], (unsigned)ctx->aead->static_iv[1]);

    return 0;
}